

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevc.cpp
# Opt level: O0

string * __thiscall
HevcVpsUnit::getDescription_abi_cxx11_(string *__return_storage_ptr__,HevcVpsUnit *this)

{
  allocator<char> local_79;
  string local_78 [32];
  string local_58;
  double local_38;
  double fps;
  allocator<char> local_1a;
  undefined1 local_19;
  HevcVpsUnit *local_18;
  HevcVpsUnit *this_local;
  string *rez;
  
  local_19 = 0;
  local_18 = this;
  this_local = (HevcVpsUnit *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"Frame rate: ",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  local_38 = getFPS(this);
  if ((local_38 != 0.0) || (NAN(local_38))) {
    doubleToStr_abi_cxx11_(&local_58,&local_38,-1);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_78,"not found",&local_79);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_78);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator(&local_79);
  }
  return __return_storage_ptr__;
}

Assistant:

string HevcVpsUnit::getDescription() const
{
    string rez("Frame rate: ");
    const double fps = getFPS();
    if (fps != 0.0)
        rez += doubleToStr(fps);
    else
        rez += string("not found");

    return rez;
}